

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

void __thiscall xmrig::HttpResponse::end(HttpResponse *this,char *data,size_t size)

{
  undefined *puVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  http_status s;
  ostream *poVar5;
  char *pcVar6;
  WriteBaton *pWVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  size_t sVar10;
  size_type sVar11;
  undefined8 uVar12;
  uv_stream_t *puVar13;
  uint uVar14;
  size_t in_RDX;
  char *in_RSI;
  HttpResponse *in_RDI;
  bool err;
  WriteBaton *baton;
  HttpContext *ctx;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *header;
  iterator __end1;
  iterator __begin1;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  stringstream ss;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  HttpResponse *in_stack_fffffffffffffbe0;
  key_type *in_stack_fffffffffffffbe8;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffbf0;
  uv_buf_t *puVar15;
  key_type *in_stack_fffffffffffffbf8;
  HttpContext *in_stack_fffffffffffffc00;
  size_t in_stack_fffffffffffffc08;
  char *in_stack_fffffffffffffc10;
  stringstream *in_stack_fffffffffffffc18;
  WriteBaton *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc50;
  allocator *paVar16;
  string *in_stack_fffffffffffffc58;
  HttpResponse *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffcc8;
  bool local_2eb;
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  string local_2a0 [39];
  byte local_279;
  WriteBaton *local_278;
  HttpContext *local_270;
  reference local_268;
  _Self local_260;
  _Self local_258;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_250;
  stringstream local_248 [16];
  ostream local_238 [383];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  size_t local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar2 = isAlive(in_stack_fffffffffffffbe0);
  if (bVar2) {
    if ((local_10 != (char *)0x0) && (local_18 == 0)) {
      local_18 = strlen(local_10);
    }
    if (local_18 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,"Content-Length",&local_39);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc18);
      setHeader(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Connection",&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"close",&local_b9);
    setHeader(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::stringstream::stringstream(local_248);
    poVar5 = std::operator<<(local_238,"HTTP/1.1 ");
    iVar4 = statusCode(in_RDI);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    poVar5 = std::operator<<(poVar5," ");
    s = statusCode(in_RDI);
    pcVar6 = http_status_str(s);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5,kCRLF);
    local_250 = &in_RDI->m_headers;
    local_258._M_node =
         (_Base_ptr)
         std::
         map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    local_260._M_node =
         (_Base_ptr)
         std::
         map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    while (bVar2 = std::operator!=(&local_258,&local_260), bVar2) {
      local_268 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)0x1e91f5);
      poVar5 = std::operator<<(local_238,(string *)local_268);
      poVar5 = std::operator<<(poVar5,": ");
      poVar5 = std::operator<<(poVar5,(string *)&local_268->second);
      std::operator<<(poVar5,kCRLF);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffbe0);
    }
    std::operator<<(local_238,kCRLF);
    local_270 = HttpContext::get(CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    pWVar7 = (WriteBaton *)operator_new(0x108);
    WriteBaton::WriteBaton
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    local_278 = pWVar7;
    iVar4 = statusCode(in_RDI);
    if (399 < iVar4) {
      iVar4 = statusCode(in_RDI);
      local_279 = 399 < iVar4;
      bVar3 = ~local_279;
      HttpContext::ip_abi_cxx11_((HttpContext *)CONCAT44(s,in_stack_fffffffffffffcc8));
      uVar8 = std::__cxx11::string::c_str();
      pcVar6 = http_method_str((local_270->super_HttpData).method);
      uVar9 = std::__cxx11::string::c_str();
      uVar14 = (uint)local_279;
      iVar4 = statusCode(in_RDI);
      sVar10 = WriteBaton::size(local_278);
      puVar1 = kUserAgent;
      paVar16 = &local_2c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c0,puVar1,paVar16);
      sVar11 = std::
               map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::count(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      puVar1 = kUserAgent;
      if (sVar11 == 0) {
        uVar12 = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2e8,puVar1,&local_2e9);
        std::
        map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::at((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        uVar12 = std::__cxx11::string::c_str();
      }
      local_2eb = sVar11 != 0;
      Log::print((Level)(ulong)((bVar3 & 1) * 3 + 3),
                 "\x1b[0;36m%s \x1b[0m\x1b[0m\x1b[1;35m%s\x1b[0m\x1b[1;37m %s \x1b[0m\x1b[1;%dm%d \x1b[0m\x1b[1;37m%zu \x1b[0m\x1b[1;30m\"%s\"\x1b[0m"
                 ,uVar8,pcVar6,uVar9,(ulong)(0x20 - (uVar14 & 1)),iVar4,sVar10,uVar12);
      if (local_2eb) {
        std::__cxx11::string::~string(local_2e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      }
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      std::__cxx11::string::~string(local_2a0);
    }
    pWVar7 = local_278;
    puVar13 = HttpContext::stream(local_270);
    puVar15 = local_278->bufs;
    sVar10 = WriteBaton::count(local_278);
    uv_write(pWVar7,puVar13,puVar15,sVar10 & 0xffffffff,WriteBaton::onWrite);
    std::__cxx11::stringstream::~stringstream(local_248);
  }
  return;
}

Assistant:

void xmrig::HttpResponse::end(const char *data, size_t size)
{
    if (!isAlive()) {
        return;
    }

    if (data && !size) {
        size = strlen(data);
    }

    if (size) {
        setHeader("Content-Length", std::to_string(size));
    }

    setHeader("Connection", "close");

    std::stringstream ss;
    ss << "HTTP/1.1 " << statusCode() << " " << http_status_str(static_cast<http_status>(statusCode())) << kCRLF;

    for (auto &header : m_headers) {
        ss << header.first << ": " << header.second << kCRLF;
    }

    ss << kCRLF;

    HttpContext *ctx  = HttpContext::get(m_id);
    WriteBaton *baton = new WriteBaton(ss, data, size, ctx);

#   ifndef APP_DEBUG
    if (statusCode() >= 400)
#   endif
    {
        const bool err = statusCode() >= 400;

        Log::print(err ? Log::ERR : Log::INFO, CYAN("%s ") CLEAR MAGENTA_BOLD("%s") WHITE_BOLD(" %s ") CSI "1;%dm%d " CLEAR WHITE_BOLD("%zu ") BLACK_BOLD("\"%s\""),
                   ctx->ip().c_str(),
                   http_method_str(static_cast<http_method>(ctx->method)),
                   ctx->url.c_str(),
                   err ? 31 : 32,
                   statusCode(),
                   baton->size(),
                   ctx->headers.count(kUserAgent) ? ctx->headers.at(kUserAgent).c_str() : nullptr
                   );
    }

    uv_write(&baton->req, ctx->stream(), baton->bufs, baton->count(), WriteBaton::onWrite);
}